

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bscb(void *parm,int ofs,int len)

{
  void *pvVar1;
  bstring ptVar2;
  bstrList *tbl;
  int mlen;
  genBstrList *g;
  int len_local;
  int ofs_local;
  void *parm_local;
  
  if (*(int *)((long)parm + 0x10) <= **(int **)((long)parm + 8)) {
    for (tbl._4_4_ = *(int *)((long)parm + 0x10) << 1; tbl._4_4_ <= **(int **)((long)parm + 8);
        tbl._4_4_ = tbl._4_4_ * 2) {
    }
    pvVar1 = realloc(*(void **)((long)parm + 8),(long)tbl._4_4_ * 8 + 8);
    if (pvVar1 == (void *)0x0) {
      return -1;
    }
    *(void **)((long)parm + 8) = pvVar1;
    *(int *)((long)parm + 0x10) = tbl._4_4_;
  }
  ptVar2 = bmidstr(*parm,ofs,len);
  *(bstring *)(*(long *)((long)parm + 8) + 8 + (long)**(int **)((long)parm + 8) * 8) = ptVar2;
  **(int **)((long)parm + 8) = **(int **)((long)parm + 8) + 1;
  return 0;
}

Assistant:

static int bscb (void * parm, int ofs, int len) {
struct genBstrList * g = (struct genBstrList *)parm;
	if (g->bl->qty >= g->mlen) {
		int mlen = g->mlen * 2;
		struct bstrList * tbl;

		while (g->bl->qty >= mlen) mlen += mlen;
		tbl = (struct bstrList *) bstr__realloc (g->bl, BLE_SZ + sizeof (bstring) * mlen);
		if (tbl == NULL) return BSTR_ERR;
		g->bl = tbl;
		g->mlen = mlen;
	}

	g->bl->entry[g->bl->qty] = bmidstr (g->b, ofs, len);
	g->bl->qty++;
	return 0;
}